

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O3

void __thiscall
node::KernelNotifications::warningSet(KernelNotifications *this,Warning id,bilingual_str *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Warnings *this_00;
  pointer pcVar4;
  bilingual_str message_00;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  string_view str;
  string safeStatus;
  string singleQuote;
  string strCmd;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffee8;
  undefined1 *puVar8;
  undefined8 in_stack_fffffffffffffef8;
  long in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 *puVar9;
  undefined8 in_stack_ffffffffffffff18;
  long in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->m_warnings;
  pcVar4 = (message->original)._M_dataplus._M_p;
  puVar8 = &stack0xffffffffffffff00;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffef0,pcVar4,pcVar4 + (message->original)._M_string_length
            );
  pcVar4 = (message->translated)._M_dataplus._M_p;
  puVar9 = &stack0xffffffffffffff20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff10,pcVar4,
             pcVar4 + (message->translated)._M_string_length);
  message_00.original._M_string_length = in_stack_fffffffffffffef8;
  message_00.original._M_dataplus._M_p = puVar8;
  message_00.original.field_2._M_allocated_capacity = in_stack_ffffffffffffff00;
  message_00.original.field_2._8_8_ = in_stack_ffffffffffffff08;
  message_00.translated._M_dataplus._M_p = puVar9;
  message_00.translated._M_string_length = in_stack_ffffffffffffff18;
  message_00.translated.field_2._M_allocated_capacity = in_stack_ffffffffffffff20;
  message_00.translated.field_2._8_8_ = in_stack_ffffffffffffff28;
  bVar5 = Warnings::Set(this_00,(warning_type)
                                in_stack_fffffffffffffee8.
                                super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                                super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                                super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                                super__Variant_storage_alias<kernel::Warning,_node::Warning>,
                        message_00);
  if (puVar9 != &stack0xffffffffffffff20) {
    operator_delete(puVar9,in_stack_ffffffffffffff20 + 1);
  }
  if (puVar8 != &stack0xffffffffffffff00) {
    operator_delete(puVar8,in_stack_ffffffffffffff00 + 1);
  }
  if (bVar5) {
    paVar2 = &local_70.field_2;
    local_70.field_2._M_allocated_capacity = 0x6f6e7472656c612d;
    local_70.field_2._8_4_ = 0x79666974;
    local_70._M_string_length = 0xc;
    local_70.field_2._M_local_buf[0xc] = '\0';
    paVar3 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar3;
    local_70._M_dataplus._M_p = (pointer)paVar2;
    ArgsManager::GetArg(&local_50,&gArgs,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar3) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_string_length != 0) {
      local_70.field_2._M_allocated_capacity._0_2_ = 0x27;
      local_70._M_string_length = 1;
      str._M_str = (message->original)._M_dataplus._M_p;
      str._M_len = (message->original)._M_string_length;
      local_70._M_dataplus._M_p = (pointer)paVar2;
      SanitizeString_abi_cxx11_(&local_90,str,0);
      std::operator+(&local_d0,&local_70,&local_90);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_d0,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar1 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar7) {
        local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_90,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_string_length = 2;
      local_b0.field_2._M_allocated_capacity._0_3_ = 0x7325;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      util::ReplaceAll(&local_50,&local_b0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
                ((thread *)&local_b0,runCommand,&local_50);
      std::thread::detach();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::terminate();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar3) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void KernelNotifications::warningSet(kernel::Warning id, const bilingual_str& message)
{
    if (m_warnings.Set(id, message)) {
        AlertNotify(message.original);
    }
}